

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::ConvolutionLayerParams::_internal_add_outputshape
          (ConvolutionLayerParams *this,uint64_t value)

{
  RepeatedField<unsigned_long> *this_00;
  uint uVar1;
  unsigned_long *puVar2;
  unsigned_long tmp;
  
  this_00 = &this->outputshape_;
  uVar1 = (this->outputshape_).current_size_;
  if (uVar1 == (this->outputshape_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar1 + 1);
    puVar2 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar2[uVar1] = value;
  }
  else {
    puVar2 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar2[uVar1] = value;
  }
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void ConvolutionLayerParams::_internal_add_outputshape(uint64_t value) {
  outputshape_.Add(value);
}